

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PFileReceiver.cpp
# Opt level: O0

int __thiscall P2PFileReceiverConnection::OnFileDone(P2PFileReceiverConnection *this,TonkFile file)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong *in_RSI;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer_3;
  undefined7 in_stack_ffffffffffffef98;
  undefined1 in_stack_ffffffffffffef9f;
  LogStringBuffer *in_stack_ffffffffffffefa0;
  LogStringBuffer *in_stack_ffffffffffffefd8;
  OutputWorker *in_stack_ffffffffffffefe0;
  Channel *buffer_00;
  LogStringBuffer *this_00;
  float local_f5c;
  ulong *local_f58;
  int local_f44;
  ulong *local_f40;
  char *local_f38;
  Channel *local_f30;
  char *local_f28;
  float *local_f20;
  char *local_f18;
  ulong *local_f10;
  char *local_f08;
  char *local_ef8;
  ulong *local_ef0;
  char *local_ee8;
  Channel *local_ee0;
  char *local_ed8;
  ulong *local_ed0;
  char *local_ec8;
  Channel *local_ec0;
  ulong *local_eb8;
  char *local_eb0;
  Channel *local_ea8;
  ulong *local_ea0;
  char *local_e98;
  undefined4 local_e8c;
  Channel *local_e88;
  undefined4 local_e7c;
  Channel *local_e78;
  undefined1 local_e60 [16];
  ostream aoStack_e50 [376];
  ulong *local_cd8;
  char *local_cd0;
  undefined4 local_cc4;
  Channel *local_cc0;
  ulong *local_cb8;
  char *local_cb0;
  undefined8 local_ca8;
  undefined1 *local_ca0;
  Channel *local_c98;
  undefined8 local_c90;
  undefined1 *local_c88;
  Channel *local_c80;
  undefined8 local_c78;
  undefined1 *local_c70;
  ulong *local_c68;
  char *local_c60;
  undefined1 *local_c58;
  Channel *local_c50;
  ulong *local_c48;
  undefined1 *local_c40;
  Channel *local_c38;
  ulong *local_c30;
  undefined1 *local_c28;
  char *local_c20;
  undefined1 *local_c18;
  Channel *local_c10;
  char *local_c08;
  undefined1 *local_c00;
  char *local_bf8;
  float *local_bf0;
  char *local_be8;
  ulong *local_be0;
  char *local_bd8;
  char *local_bc8;
  ulong *local_bc0;
  char *local_bb8;
  undefined4 local_bac;
  Channel *local_ba8;
  undefined4 local_b9c;
  Channel *local_b98;
  undefined1 local_b80 [16];
  ostream aoStack_b70 [376];
  char *local_9f8;
  float *local_9f0;
  char *local_9e8;
  ulong *local_9e0;
  char *local_9d8;
  ulong *local_9d0;
  char *local_9c8;
  ulong *local_9c0;
  char *local_9b8;
  undefined4 local_9ac;
  Channel *local_9a8;
  char *local_9a0;
  float *local_998;
  char *local_990;
  ulong *local_988;
  char *local_980;
  ulong *local_978;
  char *local_970;
  ulong *local_968;
  char *local_960;
  undefined8 local_958;
  undefined1 *local_950;
  Channel *local_948;
  undefined8 local_940;
  undefined1 *local_938;
  Channel *local_930;
  undefined8 local_928;
  undefined1 *local_920;
  char *local_918;
  float *local_910;
  char *local_908;
  ulong *local_900;
  char *local_8f8;
  ulong *local_8f0;
  char *local_8e8;
  ulong *local_8e0;
  char *local_8d8;
  undefined1 *local_8d0;
  Channel *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  Channel *local_8b0;
  char *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  float *local_890;
  char *local_888;
  ulong *local_880;
  char *local_878;
  ulong *local_870;
  char *local_868;
  ulong *local_860;
  undefined1 *local_858;
  Channel *local_850;
  ulong *local_848;
  undefined1 *local_840;
  Channel *local_838;
  ulong *local_830;
  undefined1 *local_828;
  char *local_820;
  float *local_818;
  char *local_810;
  ulong *local_808;
  char *local_800;
  ulong *local_7f8;
  char *local_7f0;
  undefined1 *local_7e8;
  Channel *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  Channel *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  float *local_7a8;
  char *local_7a0;
  ulong *local_798;
  char *local_790;
  ulong *local_788;
  undefined1 *local_780;
  Channel *local_778;
  ulong *local_770;
  undefined1 *local_768;
  Channel *local_760;
  ulong *local_758;
  undefined1 *local_750;
  char *local_748;
  float *local_740;
  char *local_738;
  ulong *local_730;
  char *local_728;
  undefined1 *local_720;
  Channel *local_718;
  char *local_710;
  undefined1 *local_708;
  Channel *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  float *local_6e0;
  char *local_6d8;
  ulong *local_6d0;
  undefined1 *local_6c8;
  Channel *local_6c0;
  ulong *local_6b8;
  undefined1 *local_6b0;
  Channel *local_6a8;
  ulong *local_6a0;
  undefined1 *local_698;
  char *local_690;
  float *local_688;
  char *local_680;
  undefined1 *local_678;
  Channel *local_670;
  char *local_668;
  undefined1 *local_660;
  Channel *local_658;
  char *local_650;
  undefined1 *local_648;
  char *local_640;
  float *local_638;
  undefined1 *local_630;
  Channel *local_628;
  float *local_620;
  undefined1 *local_618;
  Channel *local_610;
  float *local_608;
  undefined1 *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  Channel *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  ulong *local_5c8;
  char *local_5c0;
  undefined4 local_5b4;
  Channel *local_5b0;
  undefined4 local_5a4;
  Channel *local_5a0;
  undefined1 local_588 [16];
  ostream aoStack_578 [376];
  char *local_400;
  ulong *local_3f8;
  char *local_3f0;
  undefined4 local_3e4;
  Channel *local_3e0;
  char *local_3d8;
  ulong *local_3d0;
  char *local_3c8;
  undefined8 local_3c0;
  undefined1 *local_3b8;
  Channel *local_3b0;
  undefined8 local_3a8;
  undefined1 *local_3a0;
  Channel *local_398;
  undefined8 local_390;
  undefined1 *local_388;
  char *local_380;
  ulong *local_378;
  char *local_370;
  undefined1 *local_368;
  Channel *local_360;
  char *local_358;
  undefined1 *local_350;
  Channel *local_348;
  char *local_340;
  ulong *local_338;
  undefined1 *local_330;
  LogStringBuffer *local_328;
  ulong *local_320;
  undefined1 *local_318;
  LogStringBuffer *local_310;
  ulong *local_308;
  undefined1 *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  LogStringBuffer *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  ulong *local_2c0;
  char *local_2b8;
  undefined4 local_2ac;
  Channel *local_2a8;
  undefined4 local_29c;
  Channel *local_298;
  undefined1 local_280 [16];
  ostream aoStack_270 [376];
  ulong *local_f8;
  char *local_f0;
  undefined4 local_e4;
  Channel *local_e0;
  ulong *local_d8;
  char *local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  Channel *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  Channel *local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  ulong *local_88;
  char *local_80;
  undefined1 *local_78;
  Channel *local_70;
  ulong *local_68;
  undefined1 *local_60;
  Channel *local_58;
  ulong *local_50;
  undefined1 *local_48;
  char *local_40;
  undefined1 *local_38;
  Channel *local_30;
  char *local_28;
  undefined1 *local_20;
  
  if ((in_RSI[2] & 2) == 0) {
    local_ef0 = in_RSI + 3;
    local_f10 = in_RSI + 1;
    auVar1 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,*in_RSI * 100);
    auVar2 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,in_RSI[1]);
    local_f5c = auVar1._0_4_ / auVar2._0_4_;
    local_ee0 = &Logger;
    local_ee8 = "File(";
    local_ef8 = ") progress: ";
    local_f08 = " / ";
    local_f18 = " Bytes (";
    local_f20 = &local_f5c;
    local_f28 = "%)";
    local_ba8 = &Logger;
    local_bac = 2;
    local_bb8 = "File(";
    local_bc8 = ") progress: ";
    local_bd8 = " / ";
    local_be8 = " Bytes (";
    local_bf8 = "%)";
    local_b98 = &Logger;
    local_b9c = 2;
    local_f58 = in_RSI;
    local_bf0 = local_f20;
    local_be0 = local_f10;
    local_bc0 = local_ef0;
    if ((int)Logger.ChannelMinLevel < 3) {
      local_9a8 = &Logger;
      local_9ac = 2;
      local_9b8 = "File(";
      local_9c8 = ") progress: ";
      local_9d8 = " / ";
      local_9e8 = " Bytes (";
      local_9f8 = "%)";
      local_9f0 = local_f20;
      local_9e0 = local_f10;
      local_9d0 = in_RSI;
      local_9c0 = local_ef0;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffefa0,
                 (char *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),Trace);
      local_958 = 0x119318;
      local_948 = &Logger;
      local_960 = local_9b8;
      local_968 = local_9c0;
      local_970 = local_9c8;
      local_978 = local_9d0;
      local_980 = local_9d8;
      local_988 = local_9e0;
      local_990 = local_9e8;
      local_998 = local_9f0;
      local_9a0 = local_9f8;
      local_930 = &Logger;
      local_950 = local_b80;
      local_940 = local_958;
      local_938 = local_b80;
      local_928 = local_958;
      local_920 = local_b80;
      std::operator<<(aoStack_b70,(string *)&Logger.Prefix);
      local_8c8 = &Logger;
      local_8d0 = local_950;
      local_8d8 = local_960;
      local_8e0 = local_968;
      local_8e8 = local_970;
      local_8f0 = local_978;
      local_8f8 = local_980;
      local_900 = local_988;
      local_908 = local_990;
      local_910 = local_998;
      local_918 = local_9a0;
      local_8b0 = &Logger;
      local_8b8 = local_950;
      local_8c0 = local_960;
      local_8a0 = local_950;
      local_8a8 = local_960;
      std::operator<<((ostream *)(local_950 + 0x10),local_960);
      local_850 = &Logger;
      local_858 = local_8d0;
      local_860 = local_8e0;
      local_868 = local_8e8;
      local_870 = local_8f0;
      local_878 = local_8f8;
      local_880 = local_900;
      local_888 = local_908;
      local_890 = local_910;
      local_898 = local_918;
      local_838 = &Logger;
      local_840 = local_8d0;
      local_848 = local_8e0;
      local_828 = local_8d0;
      local_830 = local_8e0;
      std::operator<<((ostream *)(local_8d0 + 0x10),(char *)*local_8e0);
      local_7e0 = &Logger;
      local_7e8 = local_858;
      local_7f0 = local_868;
      local_7f8 = local_870;
      local_800 = local_878;
      local_808 = local_880;
      local_810 = local_888;
      local_818 = local_890;
      local_820 = local_898;
      local_7c8 = &Logger;
      local_7d0 = local_858;
      local_7d8 = local_868;
      local_7b8 = local_858;
      local_7c0 = local_868;
      std::operator<<((ostream *)(local_858 + 0x10),local_868);
      local_778 = &Logger;
      local_780 = local_7e8;
      local_788 = local_7f8;
      local_790 = local_800;
      local_798 = local_808;
      local_7a0 = local_810;
      local_7a8 = local_818;
      local_7b0 = local_820;
      local_760 = &Logger;
      local_768 = local_7e8;
      local_770 = local_7f8;
      local_750 = local_7e8;
      local_758 = local_7f8;
      std::ostream::operator<<((ostream *)(local_7e8 + 0x10),*local_7f8);
      local_718 = &Logger;
      local_720 = local_780;
      local_728 = local_790;
      local_730 = local_798;
      local_738 = local_7a0;
      local_740 = local_7a8;
      local_748 = local_7b0;
      local_700 = &Logger;
      local_708 = local_780;
      local_710 = local_790;
      local_6f0 = local_780;
      local_6f8 = local_790;
      std::operator<<((ostream *)(local_780 + 0x10),local_790);
      local_6c0 = &Logger;
      local_6c8 = local_720;
      local_6d0 = local_730;
      local_6d8 = local_738;
      local_6e0 = local_740;
      local_6e8 = local_748;
      local_6a8 = &Logger;
      local_6b0 = local_720;
      local_6b8 = local_730;
      local_698 = local_720;
      local_6a0 = local_730;
      std::ostream::operator<<((ostream *)(local_720 + 0x10),*local_730);
      local_670 = &Logger;
      local_678 = local_6c8;
      local_680 = local_6d8;
      local_688 = local_6e0;
      local_690 = local_6e8;
      local_658 = &Logger;
      local_660 = local_6c8;
      local_668 = local_6d8;
      local_648 = local_6c8;
      local_650 = local_6d8;
      std::operator<<((ostream *)(local_6c8 + 0x10),local_6d8);
      local_628 = &Logger;
      local_630 = local_678;
      local_638 = local_688;
      local_640 = local_690;
      local_610 = &Logger;
      local_618 = local_678;
      local_620 = local_688;
      local_600 = local_678;
      local_608 = local_688;
      std::ostream::operator<<((ostream *)(local_678 + 0x10),*local_688);
      local_5e8 = &Logger;
      local_5f0 = local_630;
      local_5f8 = local_640;
      local_5d8 = local_630;
      local_5e0 = local_640;
      std::operator<<((ostream *)(local_630 + 0x10),local_640);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x106bdd);
    }
    if (local_f58[4] == 0) {
      local_eb8 = local_f58 + 5;
      local_ea8 = &Logger;
      local_eb0 = "File transfer completed to disk: ";
      local_2a8 = &Logger;
      local_2ac = 2;
      local_2b8 = "File transfer completed to disk: ";
      local_298 = &Logger;
      local_29c = 2;
      local_2c0 = local_eb8;
      if ((int)Logger.ChannelMinLevel < 3) {
        local_e0 = &Logger;
        local_e4 = 2;
        local_f0 = "File transfer completed to disk: ";
        local_f8 = local_eb8;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_ffffffffffffefa0,
                   (char *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),Trace);
        local_c8 = 0x119318;
        local_b8 = &Logger;
        local_d0 = local_f0;
        local_d8 = local_f8;
        local_a0 = &Logger;
        local_c0 = local_280;
        local_b0 = local_c8;
        local_a8 = local_280;
        local_98 = local_c8;
        local_90 = local_280;
        std::operator<<(aoStack_270,(string *)&Logger.Prefix);
        local_70 = &Logger;
        local_78 = local_c0;
        local_80 = local_d0;
        local_88 = local_d8;
        local_30 = &Logger;
        local_38 = local_c0;
        local_40 = local_d0;
        local_20 = local_c0;
        local_28 = local_d0;
        std::operator<<((ostream *)(local_c0 + 0x10),local_d0);
        local_58 = &Logger;
        local_60 = local_78;
        local_68 = local_88;
        local_48 = local_78;
        local_50 = local_88;
        std::operator<<((ostream *)(local_78 + 0x10),(char *)*local_88);
        in_stack_ffffffffffffefa0 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x107384);
      }
      remove((char *)local_f58[3]);
      rename((char *)local_f58[5],(char *)local_f58[3]);
    }
    else {
      local_ed0 = local_f58 + 1;
      local_ec0 = &Logger;
      local_ec8 = "Written to memory buffer: ";
      local_ed8 = " bytes";
      local_5b0 = &Logger;
      local_5b4 = 2;
      local_5c0 = "Written to memory buffer: ";
      local_5d0 = " bytes";
      local_5a0 = &Logger;
      local_5a4 = 2;
      local_5c8 = local_ed0;
      if ((int)Logger.ChannelMinLevel < 3) {
        local_3e0 = &Logger;
        local_3e4 = 2;
        local_3f0 = "Written to memory buffer: ";
        local_400 = " bytes";
        local_3f8 = local_ed0;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_ffffffffffffefa0,
                   (char *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),Trace);
        local_3c0 = 0x119318;
        local_3b0 = &Logger;
        local_3c8 = local_3f0;
        local_3d0 = local_3f8;
        local_3d8 = local_400;
        local_398 = &Logger;
        local_3b8 = local_588;
        local_3a8 = local_3c0;
        local_3a0 = local_588;
        local_390 = local_3c0;
        local_388 = local_588;
        std::operator<<(aoStack_578,(string *)&Logger.Prefix);
        local_360 = &Logger;
        local_368 = local_3b8;
        local_370 = local_3c8;
        local_378 = local_3d0;
        local_380 = local_3d8;
        buffer_00 = &Logger;
        local_348 = &Logger;
        local_350 = local_3b8;
        local_358 = local_3c8;
        local_2f0 = local_3b8;
        local_2f8 = local_3c8;
        std::operator<<((ostream *)(local_3b8 + 0x10),local_3c8);
        local_330 = local_368;
        local_338 = local_378;
        local_340 = local_380;
        local_318 = local_368;
        local_320 = local_378;
        local_300 = local_368;
        local_308 = local_378;
        this_00 = (LogStringBuffer *)buffer_00;
        local_328 = (LogStringBuffer *)buffer_00;
        local_310 = (LogStringBuffer *)buffer_00;
        std::ostream::operator<<((ostream *)(local_368 + 0x10),*local_378);
        local_2e0 = local_330;
        local_2e8 = local_340;
        local_2c8 = local_330;
        local_2d0 = local_340;
        local_2d8 = (LogStringBuffer *)buffer_00;
        std::operator<<((ostream *)(local_330 + 0x10),local_340);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write((OutputWorker *)this_00,(LogStringBuffer *)buffer_00);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10703a);
      }
    }
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_ffffffffffffefa0,(bool)in_stack_ffffffffffffef9f);
    local_f44 = 0;
  }
  else {
    local_f40 = in_RSI + 3;
    local_f30 = &Logger;
    local_f38 = "File transfer failed: ";
    local_e88 = &Logger;
    local_e8c = 4;
    local_e98 = "File transfer failed: ";
    local_e78 = &Logger;
    local_e7c = 4;
    if ((int)Logger.ChannelMinLevel < 5) {
      local_cc0 = &Logger;
      local_cc4 = 4;
      local_cd0 = "File transfer failed: ";
      local_ea0 = local_f40;
      local_cd8 = local_f40;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffefa0,
                 (char *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),Trace);
      local_ca8 = 0x119318;
      local_c98 = &Logger;
      local_cb0 = local_cd0;
      local_cb8 = local_cd8;
      local_c80 = &Logger;
      local_ca0 = local_e60;
      local_c90 = local_ca8;
      local_c88 = local_e60;
      local_c78 = local_ca8;
      local_c70 = local_e60;
      std::operator<<(aoStack_e50,(string *)&Logger.Prefix);
      local_c50 = &Logger;
      local_c58 = local_ca0;
      local_c60 = local_cb0;
      local_c68 = local_cb8;
      local_c10 = &Logger;
      local_c18 = local_ca0;
      local_c20 = local_cb0;
      local_c00 = local_ca0;
      local_c08 = local_cb0;
      std::operator<<((ostream *)(local_ca0 + 0x10),local_cb0);
      local_c38 = &Logger;
      local_c40 = local_c58;
      local_c48 = local_c68;
      local_c28 = local_c58;
      local_c30 = local_c68;
      std::operator<<((ostream *)(local_c58 + 0x10),(char *)*local_c68);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x105fdf);
    }
    local_f44 = 1;
  }
  return local_f44;
}

Assistant:

int P2PFileReceiverConnection::OnFileDone(TonkFile file)
{
    if (file->Flags & TonkFileFlags_Failed)
    {
        Logger.Error("File transfer failed: ", file->Name);
        return TONK_FILE_DELETE;
    }

    Logger.Info("File(", file->Name, ") progress: ", file->ProgressBytes, " / ", file->TotalBytes,
        " Bytes (", file->ProgressBytes * 100 / (float)file->TotalBytes, "%)");

    if (file->OutputData)
    {
        Logger.Info("Written to memory buffer: ", file->TotalBytes, " bytes");
    }
    else
    {
        Logger.Info("File transfer completed to disk: ", file->OutputFileName);

        // Delete any old file with the target name
        std::remove(file->Name);

        // Rename the output file to the target file name
        std::rename(file->OutputFileName, file->Name);
    }

    // Mark it as complete so the session ends
    Receiver->Complete = true;

    return TONK_FILE_KEEP;
}